

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std.cpp
# Opt level: O1

int lib_atoi(char *str,size_t len)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  
  iVar2 = 1;
  iVar1 = 0;
  if (len == 0) {
    len = 0;
  }
  else if (*str == '+') {
    str = str + 1;
    len = len - 1;
  }
  else if (*str == '-') {
    str = str + 1;
    len = len - 1;
    iVar2 = -1;
  }
  if (len != 0) {
    sVar3 = 0;
    iVar1 = 0;
    do {
      if (9 < (int)str[sVar3] - 0x30U) break;
      iVar1 = ((int)str[sVar3] - 0x30U) + iVar1 * 10;
      sVar3 = sVar3 + 1;
    } while (len != sVar3);
  }
  return iVar1 * iVar2;
}

Assistant:

int lib_atoi(const char *str, size_t len)
{
    /* parse the sign, if present */
    int s = 1;
    if (len >= 1 && *str == '-')
        s = -1, ++str, --len;
    else if (len >= 1 && *str == '+')
        ++str, --len;

    /* scan digits */
    int acc;
    for (acc = 0 ; len > 0 && is_digit(*str) ;
         acc *= 10, acc += value_of_digit(*str), ++str, --len) ;

    /* apply the sign and return the result */
    return s * acc;
}